

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::setLayout(QFormLayout *this,int row,ItemRole role,QLayout *layout)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  QFormLayoutPrivate *in_RDI;
  QFormLayoutPrivate *unaff_retaddr;
  int rowCnt;
  QFormLayoutPrivate *d;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QFormLayoutPrivate *pQVar2;
  
  pQVar2 = in_RDI;
  d_func((QFormLayout *)0x4b8839);
  iVar1 = rowCount((QFormLayout *)in_RDI);
  if (iVar1 <= in_ESI) {
    QFormLayoutPrivate::insertRows(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  QFormLayoutPrivate::setLayout
            (unaff_retaddr,(int)((ulong)pQVar2 >> 0x20),(ItemRole)pQVar2,
             (QLayout *)CONCAT44(in_ESI,in_EDX));
  return;
}

Assistant:

void QFormLayout::setLayout(int row, ItemRole role, QLayout *layout)
{
    Q_D(QFormLayout);
    int rowCnt = rowCount();
    if (row >= rowCnt)
        d->insertRows(rowCnt, row - rowCnt + 1);
    d->setLayout(row, role, layout);
}